

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::regexp_literal_expression::print(regexp_literal_expression *this,wostream *os)

{
  regexp_flag f;
  wostream *pwVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wstring_view __str;
  wostream *os_local;
  regexp_literal_expression *this_local;
  
  pwVar1 = std::operator<<(os,"regexp_literal_expression{");
  __str = regexp::pattern(&this->re_);
  pbVar2 = std::operator<<(pwVar1,__str);
  pwVar1 = std::operator<<(pbVar2,", ");
  f = regexp::flags(&this->re_);
  pwVar1 = mjs::operator<<(pwVar1,f);
  std::operator<<(pwVar1,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "regexp_literal_expression{" << re_.pattern() << ", " << re_.flags() << "}";
    }